

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

void indent_buffer(Buffer *buffer,int n,int newline)

{
  int iVar1;
  int iVar2;
  
  if (newline == 0) {
    buffer_append(buffer,indent_buffer::spaces,1);
    return;
  }
  iVar2 = n + 1;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return;
    }
    iVar1 = buffer_append(buffer,indent_buffer::spaces,4);
  } while (iVar1 != 0);
  return;
}

Assistant:

static void indent_buffer(Buffer *buffer, int n, const int newline)
{
#if MATCH_MICROSOFT_PREPROCESSOR
    static char spaces[4] = { ' ', ' ', ' ', ' ' };
    if (newline)
    {
        while (n--)
        {
            if (!buffer_append(buffer, spaces, sizeof (spaces)))
                return;
        } // while
    } // if
    else
    {
        if (!buffer_append(buffer, spaces, 1))
            return;
    } // else
#endif
}